

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Polynomial<double> *
OpenMD::operator*(Polynomial<double> *__return_storage_ptr__,Polynomial<double> *p1,
                 Polynomial<double> *p2)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  double local_38;
  
  p_Var3 = &(__return_storage_ptr__->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (__return_storage_ptr__->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (__return_storage_ptr__->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (p1->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(p1->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      for (p_Var1 = (p2->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var1 != &(p2->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
          p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
        local_38 = (double)p_Var2[1]._M_parent * (double)p_Var1[1]._M_parent;
        Polynomial<double>::addCoefficient
                  (__return_storage_ptr__,p_Var1[1]._M_color + p_Var2[1]._M_color,&local_38);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial<Real> operator*(const Polynomial<Real>& p1,
                             const Polynomial<Real>& p2) {
    typename Polynomial<Real>::const_iterator i;
    typename Polynomial<Real>::const_iterator j;
    Polynomial<Real> p;

    for (i = p1.begin(); i != p1.end(); ++i) {
      for (j = p2.begin(); j != p2.end(); ++j) {
        p.addCoefficient(i->first + j->first, i->second * j->second);
      }
    }

    return p;
  }